

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

int __thiscall
jsoncons::jsonpath::detail::
identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
::select(identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
         *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
        timeval *__timeout)

{
  bool bVar1;
  __type_conflict1 _Var2;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar3;
  undefined7 extraout_var;
  reference this_00;
  size_t sVar4;
  _Hash_node_base *p_Var5;
  _Hash_node_base *extraout_RAX;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *this_01;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *pbVar6;
  undefined4 in_register_00000034;
  const_object_iterator cVar7;
  iterator iVar8;
  type tVar9;
  pointer ptr_1;
  size_t count;
  string_view_type sv;
  pointer ptr;
  size_t index;
  type r;
  int64_t n;
  const_object_iterator it;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  undefined4 in_stack_fffffffffffffda0;
  result_options in_stack_fffffffffffffda4;
  string_view_type *in_stack_fffffffffffffda8;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *peVar10;
  path_node_type *in_stack_fffffffffffffdb0;
  path_node_type *last;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffdb8;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *peVar11;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
  *in_stack_fffffffffffffdc0;
  fd_set *root;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffdc8;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *context;
  base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffdd0;
  unsigned_long *in_stack_fffffffffffffdd8;
  result_options rVar12;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *in_stack_fffffffffffffde0;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  string_view_type *in_stack_fffffffffffffe18;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  _Hash_node_base *local_1a8;
  undefined1 local_13a [10];
  type_conflict2 local_130;
  string_view_type local_128;
  undefined1 local_118 [16];
  allocator<char> local_f2;
  undefined1 local_f1;
  __buckets_ptr local_f0;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *local_e8;
  __node_base local_e0;
  wchar_t *local_d8;
  to_integer_errc local_d0;
  wchar_t *local_c8;
  to_integer_errc local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [16];
  undefined8 local_a0;
  undefined1 local_98;
  range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
  local_90;
  key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_70;
  undefined1 local_68;
  key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_60;
  undefined1 local_58;
  undefined1 local_50 [16];
  key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
  *local_40;
  undefined1 local_38;
  timeval *local_30;
  fd_set *local_28;
  path_node_type *local_20;
  fd_set *local_18;
  eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_10;
  identifier_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  *local_8;
  
  local_10 = (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)CONCAT44(in_register_00000034,__nfds);
  local_30 = __timeout;
  local_28 = __exceptfds;
  local_20 = (path_node_type *)__writefds;
  local_18 = __readfds;
  local_8 = this;
  bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_object
                    ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffffdb8);
  if (bVar1) {
    local_50 = std::__cxx11::wstring::operator_cast_to_basic_string_view
                         ((wstring *)&this->identifier_);
    rVar12 = (result_options)in_stack_fffffffffffffde0;
    cVar7 = basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::find_abi_cxx11_
                      (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
    local_60 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)cVar7.it_._M_current;
    local_58 = cVar7.has_value_;
    local_40 = local_60;
    local_38 = local_58;
    basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::object_range_abi_cxx11_
              (in_stack_fffffffffffffe50);
    iVar8 = range<jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>,_jsoncons::detail::random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>_>
            ::end(&local_90);
    local_a0 = iVar8.it_._M_current;
    local_98 = iVar8.has_value_;
    local_70 = (key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
                *)local_a0;
    local_68 = local_98;
    bVar1 = jsoncons::detail::
            random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
            ::operator!=((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                          *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                         (random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                          *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    iVar3 = (int)CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      local_b0 = std::__cxx11::wstring::operator_cast_to_basic_string_view
                           ((wstring *)&this->identifier_);
      path_generator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
      ::generate(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                 in_stack_fffffffffffffda4);
      this_00 = jsoncons::detail::
                random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                ::operator*((random_access_iterator_wrapper<__gnu_cxx::__normal_iterator<const_jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_*,_std::vector<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>_>_>_>,_void>
                             *)0x672a86);
      key_value<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
      ::value(this_00);
      base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
      ::tail_select(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                    (reference)in_stack_fffffffffffffdc0,(path_node_type *)in_stack_fffffffffffffdb8
                    ,(reference)in_stack_fffffffffffffdb0,
                    (node_receiver_type *)in_stack_fffffffffffffda8,rVar12);
      iVar3 = extraout_EAX;
    }
  }
  else {
    bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_array
                      ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                       in_stack_fffffffffffffdb8);
    if (bVar1) {
      local_b8 = (_Hash_node_base *)0x0;
      std::__cxx11::wstring::data();
      std::__cxx11::wstring::size();
      tVar9 = jsoncons::detail::dec_to_integer<long,wchar_t>
                        ((wchar_t *)in_stack_fffffffffffffde0,(size_t)in_stack_fffffffffffffdd8,
                         (long *)in_stack_fffffffffffffdd0);
      local_d8 = tVar9.ptr;
      local_d0 = tVar9.ec;
      local_c8 = local_d8;
      local_c0 = local_d0;
      bVar1 = jsoncons::detail::to_integer_result::operator_cast_to_bool
                        ((to_integer_result *)&local_c8);
      if (bVar1) {
        if ((long)local_b8 < 0) {
          sVar4 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                            ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                             in_stack_fffffffffffffda8);
          local_1a8 = (_Hash_node_base *)(sVar4 + local_b8);
        }
        else {
          local_1a8 = (_Hash_node_base *)local_b8;
        }
        rVar12 = (result_options)in_stack_fffffffffffffde0;
        local_e0._M_nxt = local_1a8;
        p_Var5 = (_Hash_node_base *)
                 basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                           ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                            in_stack_fffffffffffffda8);
        if (local_1a8 < p_Var5) {
          path_generator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::generate(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                     (size_t)in_stack_fffffffffffffda8,in_stack_fffffffffffffda4);
          basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::operator[]
                    ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                     CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
          base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::tail_select(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                        (reference)in_stack_fffffffffffffdc0,
                        (path_node_type *)in_stack_fffffffffffffdb8,
                        (reference)in_stack_fffffffffffffdb0,
                        (node_receiver_type *)in_stack_fffffffffffffda8,rVar12);
          local_1a8 = extraout_RAX;
        }
        iVar3 = (int)local_1a8;
      }
      else {
        eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
        ::length_label_abi_cxx11_
                  ((eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                    *)local_10);
        _Var2 = std::operator==(in_stack_fffffffffffffdc0,
                                (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)in_stack_fffffffffffffdb8);
        iVar3 = (int)CONCAT71(extraout_var_00,_Var2);
        if (_Var2) {
          basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                    ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffffda8);
          local_f0 = (__buckets_ptr)
                     basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::size
                               ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>
                                 *)in_stack_fffffffffffffda8);
          local_f1 = 0;
          eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::get_allocator((eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                           *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
          pbVar6 = eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                   ::create_json<unsigned_long,jsoncons::semantic_tag,std::allocator<char>>
                             (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,
                              (semantic_tag *)in_stack_fffffffffffffdd0,
                              (allocator<char> *)in_stack_fffffffffffffdc8);
          rVar12 = (result_options)in_stack_fffffffffffffde0;
          std::allocator<char>::~allocator(&local_f2);
          local_e8 = pbVar6;
          local_118 = std::__cxx11::wstring::operator_cast_to_basic_string_view
                                ((wstring *)&this->identifier_);
          path_generator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::generate(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
                     in_stack_fffffffffffffda4);
          base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::tail_select(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
                        (reference)in_stack_fffffffffffffdc0,
                        (path_node_type *)in_stack_fffffffffffffdb8,
                        (reference)in_stack_fffffffffffffdb0,
                        (node_receiver_type *)in_stack_fffffffffffffda8,rVar12);
          iVar3 = extraout_EAX_00;
        }
      }
    }
    else {
      bVar1 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string
                        ((basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *)
                         in_stack_fffffffffffffdb8);
      iVar3 = (int)CONCAT71(extraout_var_01,bVar1);
      if (bVar1) {
        eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
        ::length_label_abi_cxx11_
                  ((eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                    *)local_10);
        _Var2 = std::operator==(in_stack_fffffffffffffdc0,
                                (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                 *)in_stack_fffffffffffffdb8);
        iVar3 = (int)CONCAT71(extraout_var_02,_Var2);
        if (_Var2) {
          local_128 = basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::
                      as_string_view(in_stack_fffffffffffffe00);
          context = (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                     *)&local_128;
          this_01 = (base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                     *)std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::data
                                 ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)context)
          ;
          std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::size
                    ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)context);
          local_130 = unicode_traits::count_codepoints<wchar_t>
                                ((wchar_t *)in_stack_fffffffffffffde0,
                                 (size_t)in_stack_fffffffffffffdd8,
                                 (conv_flags)((ulong)this_01 >> 0x20));
          local_13a[1] = 0;
          peVar10 = (eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                     *)local_13a;
          peVar11 = local_10;
          eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::get_allocator((eval_context<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
                           *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
          pbVar6 = eval_context<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>,jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>const&>
                   ::create_json<unsigned_long&,jsoncons::semantic_tag,std::allocator<char>>
                             (peVar10,(unsigned_long *)peVar11,(semantic_tag *)this_01,
                              (allocator<char> *)context);
          rVar12 = (result_options)peVar10;
          std::allocator<char>::~allocator((allocator<char> *)local_13a);
          peVar10 = local_10;
          last = local_20;
          peVar11 = local_10;
          root = local_18;
          local_13a._2_8_ = pbVar6;
          std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&this->identifier_);
          path_generator<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::generate(peVar11,last,(string_view_type *)peVar10,in_stack_fffffffffffffda4);
          base_selector<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_const_jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
          ::tail_select(this_01,context,(reference)root,(path_node_type *)peVar11,(reference)last,
                        (node_receiver_type *)peVar10,rVar12);
          iVar3 = extraout_EAX_01;
        }
      }
    }
  }
  return iVar3;
}

Assistant:

void select(eval_context<Json,JsonReference>& context,
            reference root,
            const path_node_type& last, 
            reference current,
            node_receiver_type& receiver,
            result_options options) const override
        {
            if (current.is_object())
            {
                auto it = current.find(identifier_);
                if (it != current.object_range().end())
                {
                    this->tail_select(context, root, 
                                        path_generator_type::generate(context, last, identifier_, options),
                                        (*it).value(), receiver, options);
                }
            }
            else if (current.is_array())
            {
                int64_t n{0};
                auto r = jsoncons::detail::dec_to_integer(identifier_.data(), identifier_.size(), n);
                if (r)
                {
                    auto index = (n >= 0) ? static_cast<std::size_t>(n) : static_cast<std::size_t>(static_cast<int64_t>(current.size()) + n);
                    if (index < current.size())
                    {
                        this->tail_select(context, root, 
                                            path_generator_type::generate(context, last, index, options),
                                            current[index], receiver, options);
                    }
                }
                else if (identifier_ == context.length_label() && current.size() >= 0)
                {
                    pointer ptr = context.create_json(current.size(), semantic_tag::none, context.get_allocator());
                    this->tail_select(context, root, 
                                        path_generator_type::generate(context, last, identifier_, options), 
                                        *ptr, 
                                        receiver, options);
                }
            }
            else if (current.is_string() && identifier_ == context.length_label())
            {
                string_view_type sv = current.as_string_view();
                std::size_t count = unicode_traits::count_codepoints(sv.data(), sv.size());
                pointer ptr = context.create_json(count, semantic_tag::none, context.get_allocator());
                this->tail_select(context, root, 
                                    path_generator_type::generate(context, last, identifier_, options), 
                                    *ptr, receiver, options);
            }
            //std::cout << "end identifier_selector\n";
        }